

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *__s;
  char *pcVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  allocator<char> local_21;
  long local_20;
  
  __s = FLAGS_gtest_output_abi_cxx11_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = strchr(FLAGS_gtest_output_abi_cxx11_,0x3a);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_21);
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      std::string(gtest_output_flag) :
      std::string(gtest_output_flag, colon - gtest_output_flag);
}